

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding2.c
# Opt level: O1

BOOL objc_layout_structure_next_member(objc_struct_layout *layout)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  char *type;
  size_t align;
  char *type_00;
  size_t *align_00;
  
  pcVar1 = layout->type;
  layout->record_size = 0;
  layout->record_align = 0;
  layout->prev_type = pcVar1;
  pcVar4 = layout->original_type + 1;
  do {
    cVar2 = *pcVar4;
    if (cVar2 == '}') goto LAB_00112a56;
    pcVar4 = pcVar4 + 1;
  } while (cVar2 != '=');
  cVar2 = *pcVar4;
  if (cVar2 != '}') {
    do {
      type = pcVar4;
      if (cVar2 == '\"') {
        pcVar4 = pcVar4 + 1;
        do {
          type = pcVar4 + 1;
          cVar2 = *pcVar4;
          pcVar4 = type;
        } while (cVar2 != '\"');
      }
      type_00 = (char *)0x0;
      align_00 = (size_t *)0x0;
      pcVar4 = sizeof_type(type,(size_t *)&stack0xffffffffffffffc0);
      alignof_type(type_00,align_00);
      if (layout->prev_type < type) {
        if (layout->record_align == 0) {
          layout->record_align = (uint)type_00;
          layout->type = type;
        }
      }
      else {
        uVar3 = layout->record_size;
        if ((type_00 != (char *)0x0) && ((ulong)uVar3 % (ulong)type_00 != 0)) {
          uVar3 = ((uint)type_00 + uVar3) - (int)((ulong)uVar3 % (ulong)type_00);
        }
        layout->record_size = uVar3 + (int)align_00;
      }
      cVar2 = *pcVar4;
    } while (cVar2 != '}');
  }
LAB_00112a56:
  return layout->type != pcVar1;
}

Assistant:

OBJC_PUBLIC
BOOL objc_layout_structure_next_member(struct objc_struct_layout *layout)
{
	const char *end = layout->type;
	layout->record_size = 0;
	layout->record_align = 0;
	layout->prev_type = layout->type;
	const char *type = layout->original_type;
	parse_struct(&type, (type_parser)layout_structure_callback, layout);
	//printf("Calculated: (%s) %s %d %d\n", layout->original_type, layout->type, layout->record_size, layout->record_align);
	//printf("old start %s, new start %s\n", end, layout->type);
	return layout->type != end;
}